

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_layout_mapping_right_basics.cpp
# Opt level: O2

void test_1d_static<30ul>(void)

{
  uint local_bc;
  int *local_b8;
  int *local_b0;
  int dptr [30];
  
  dptr[0]._0_1_ = 1;
  local_b8 = (int *)CONCAT71(local_b8._1_7_,1);
  boost::detail::test_eq_impl<bool,bool>
            ("(l.is_regular())","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_basics.cpp"
             ,0x1d,"void test_1d_static() [X = 30UL]",(bool *)dptr,(bool *)&local_b8);
  dptr[0] = 1;
  dptr[1] = 0;
  local_b8 = (int *)CONCAT44(local_b8._4_4_,1);
  boost::detail::test_eq_impl<unsigned_long,int>
            ("(l.stride(0))","1",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_basics.cpp"
             ,0x1f,"void test_1d_static() [X = 30UL]",(unsigned_long *)dptr,(int *)&local_b8);
  dptr[0] = 0x1e;
  dptr[1] = 0;
  local_b8 = (int *)0x1e;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(l.size())","X",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_basics.cpp"
             ,0x21,"void test_1d_static() [X = 30UL]",(unsigned_long *)dptr,
             (unsigned_long *)&local_b8);
  dptr[0] = 0x1e;
  dptr[1] = 0;
  local_b8 = (int *)0x1e;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(l.span())","X",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_basics.cpp"
             ,0x22,"void test_1d_static() [X = 30UL]",(unsigned_long *)dptr,
             (unsigned_long *)&local_b8);
  for (local_bc = 0; local_bc < 0x1e; local_bc = local_bc + 1) {
    local_b8 = (int *)(ulong)local_bc;
    boost::detail::test_eq_impl<unsigned_long,int>
              ("(l.index(i))","i",
               "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_basics.cpp"
               ,0x29,"void test_1d_static() [X = 30UL]",(unsigned_long *)&local_b8,(int *)&local_bc)
    ;
    local_b8 = dptr + (int)local_bc;
    local_b0 = local_b8;
    boost::detail::test_eq_impl<int*,int*>
              ("&(dptr[l.index(i)])","&(dptr[i])",
               "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_basics.cpp"
               ,0x2b,"void test_1d_static() [X = 30UL]",&local_b8,&local_b0);
    dptr[(int)local_bc] = local_bc;
    boost::detail::test_eq_impl<int,int>
              ("(dptr[l.index(i)])","i",
               "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_basics.cpp"
               ,0x2f,"void test_1d_static() [X = 30UL]",dptr + (int)local_bc,(int *)&local_bc);
  }
  return;
}

Assistant:

void test_1d_static()
{ // {{{
    layout_mapping_right<
        dimensions<X>, dimensions<1>, dimensions<0>
    > const l{};

    BOOST_TEST_EQ((l.is_regular()), true);

    BOOST_TEST_EQ((l.stride(0)), 1);

    BOOST_TEST_EQ((l.size()), X);
    BOOST_TEST_EQ((l.span()), X);

    int dptr[X];

    // Set all elements to a unique value.
    for (auto i = 0; i < l[0]; ++i)
    {
        BOOST_TEST_EQ((l.index(i)), i);

        BOOST_TEST_EQ(&(dptr[l.index(i)]), &(dptr[i])); 

        dptr[l.index(i)] = i;

        BOOST_TEST_EQ((dptr[l.index(i)]), i); 
    }
}